

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O0

int BamTools::UnpackSignedInt(char *buffer)

{
  anon_union_4_2_0fb6f4e1 un;
  char *buffer_local;
  
  return *(int *)buffer;
}

Assistant:

API_EXPORT inline signed int UnpackSignedInt(const char* buffer)
{
    union
    {
        signed int value;
        unsigned char valueBuffer[sizeof(signed int)];
    } un;
    un.value = 0;
    un.valueBuffer[0] = buffer[0];
    un.valueBuffer[1] = buffer[1];
    un.valueBuffer[2] = buffer[2];
    un.valueBuffer[3] = buffer[3];
    return un.value;
}